

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaGrammar::SchemaGrammar(SchemaGrammar *this,MemoryManager *manager)

{
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar1;
  NameIdPool<xercesc_4_0::XMLNotationDecl> *this_00;
  XMLSchemaDescriptionImpl *this_01;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *this_02;
  OutOfMemoryException *anon_var_0;
  undefined1 local_40 [8];
  CleanupType_conflict28 cleanup;
  MemoryManager *manager_local;
  SchemaGrammar *this_local;
  
  Grammar::Grammar(&this->super_Grammar);
  (this->super_Grammar).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaGrammar_00536b60;
  this->fTargetNamespace = (XMLCh *)0x0;
  this->fElemDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fElemNonDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fGroupElemDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fNotationDeclPool = (NameIdPool<xercesc_4_0::XMLNotationDecl> *)0x0;
  this->fAttributeDeclRegistry =
       (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)0x0;
  this->fComplexTypeRegistry =
       (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fGroupInfoRegistry =
       (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fAttGroupInfoRegistry =
       (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fValidSubstitutionGroups =
       (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        *)0x0;
  this->fMemoryManager = manager;
  this->fGramDesc = (XMLSchemaDescription *)0x0;
  this->fAnnotations = (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)0x0;
  this->fValidated = false;
  DatatypeValidatorFactory::DatatypeValidatorFactory(&this->fDatatypeRegistry,manager);
  this->fScopeCount = 0;
  this->fAnonTypeCount = 0;
  JanitorMemFunCall<xercesc_4_0::SchemaGrammar>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::SchemaGrammar> *)local_40,this,(MFPT)cleanUp);
  pRVar1 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x40,this->fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (pRVar1,0x6d,true,0x80,this->fMemoryManager);
  this->fElemDeclPool = pRVar1;
  pRVar1 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x40,this->fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (pRVar1,0x6d,false,0x80,this->fMemoryManager);
  this->fGroupElemDeclPool = pRVar1;
  this_00 = (NameIdPool<xercesc_4_0::XMLNotationDecl> *)
            XMemory::operator_new(0x58,this->fMemoryManager);
  NameIdPool<xercesc_4_0::XMLNotationDecl>::NameIdPool(this_00,0x6d,0x80,this->fMemoryManager);
  this->fNotationDeclPool = this_00;
  this_01 = (XMLSchemaDescriptionImpl *)XMemory::operator_new(0x40,this->fMemoryManager);
  XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
            (this_01,(XMLCh *)XMLUni::fgXMLNSURIName,this->fMemoryManager);
  this->fGramDesc = (XMLSchemaDescription *)this_01;
  this_02 = (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)
            XMemory::operator_new(0x38,this->fMemoryManager);
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::RefHashTableOf
            (this_02,0x1d,true,this->fMemoryManager);
  this->fAnnotations = this_02;
  (*(this->super_Grammar).super_XSerializable._vptr_XSerializable[0x14])();
  JanitorMemFunCall<xercesc_4_0::SchemaGrammar>::release
            ((JanitorMemFunCall<xercesc_4_0::SchemaGrammar> *)local_40);
  JanitorMemFunCall<xercesc_4_0::SchemaGrammar>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::SchemaGrammar> *)local_40);
  return;
}

Assistant:

SchemaGrammar::SchemaGrammar(MemoryManager* const manager) :
    fTargetNamespace(0)
    , fElemDeclPool(0)
    , fElemNonDeclPool(0)
    , fGroupElemDeclPool(0)
    , fNotationDeclPool(0)
    , fAttributeDeclRegistry(0)
    , fComplexTypeRegistry(0)
    , fGroupInfoRegistry(0)
    , fAttGroupInfoRegistry(0)
    , fValidSubstitutionGroups(0)
    , fMemoryManager(manager)
    , fGramDesc(0)
    , fAnnotations(0)
    , fValidated(false)
    , fDatatypeRegistry(manager)
    , fScopeCount (0)
    , fAnonTypeCount (0)
{
    CleanupType cleanup(this, &SchemaGrammar::cleanUp);

    //
    //  Init all the pool members.
    //
    //  <TBD> Investigate what the optimum values would be for the various
    //  pools.
    //
    fElemDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(109, true, 128, fMemoryManager);

    try {
        // should not be necessary now that grammars, once built,
        // are read-only
        // fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        fGroupElemDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(109, false, 128, fMemoryManager);
        fNotationDeclPool = new (fMemoryManager) NameIdPool<XMLNotationDecl>(109, 128, fMemoryManager);

        //REVISIT: use grammarPool to create
        fGramDesc = new (fMemoryManager) XMLSchemaDescriptionImpl(XMLUni::fgXMLNSURIName, fMemoryManager);

        // Create annotation table
        fAnnotations = new (fMemoryManager) RefHashTableOf<XSAnnotation, PtrHasher>
        (
            29, true, fMemoryManager
        );

        //
        //  Call our own reset method. This lets us have the pool setup stuff
        //  done in just one place (because this stame setup stuff has to be
        //  done every time we are reset.)
        //
        reset();
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}